

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECore.cpp
# Opt level: O2

bufsize_t __thiscall PECore::getAlignment(PECore *this,addr_type aType)

{
  uint uVar1;
  IMAGE_OPTIONAL_HEADER64 *pIVar2;
  
  pIVar2 = (IMAGE_OPTIONAL_HEADER64 *)this->opt32;
  if ((pIVar2 == (IMAGE_OPTIONAL_HEADER64 *)0x0) &&
     (pIVar2 = this->opt64, pIVar2 == (IMAGE_OPTIONAL_HEADER64 *)0x0)) {
    uVar1 = 0;
  }
  else if (aType == RAW) {
    uVar1 = pIVar2->FileAlignment;
  }
  else {
    uVar1 = pIVar2->SectionAlignment;
  }
  return (ulong)uVar1;
}

Assistant:

bufsize_t PECore::getAlignment(Executable::addr_type aType) const
{
    if (this->opt32) {
        if (aType == Executable::RAW) return opt32->FileAlignment;
        return opt32->SectionAlignment;
    }
    if (this->opt64) {
        if (aType == Executable::RAW) return opt64->FileAlignment;
        return opt64->SectionAlignment;
    }
    return 0;
}